

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ActiveAttributesCase::test(ActiveAttributesCase *this)

{
  CallLogWrapper *pCVar1;
  TestContext *pTVar2;
  bool bVar3;
  GLint GVar4;
  GLuint GVar5;
  GLuint shader;
  GLuint program;
  deBool dVar6;
  bool bVar7;
  GLint written;
  GLint size;
  GLuint local_9d0;
  GLuint local_9cc;
  GLuint local_9c8;
  GLenum type;
  CallLogWrapper *local_9c0;
  GLint written_1;
  GLint local_9b0 [2];
  TestLog local_9a8 [13];
  ios_base local_940 [264];
  char buffer [2048];
  
  pCVar1 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar5 = glu::CallLogWrapper::glCreateShader(pCVar1,0x8b31);
  shader = glu::CallLogWrapper::glCreateShader(pCVar1,0x8b30);
  glu::CallLogWrapper::glShaderSource(pCVar1,GVar5,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(pCVar1,shader,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(pCVar1,GVar5);
  glu::CallLogWrapper::glCompileShader(pCVar1,shader);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(pCVar1);
  local_9c8 = GVar5;
  glu::CallLogWrapper::glAttachShader(pCVar1,program,GVar5);
  local_9cc = shader;
  glu::CallLogWrapper::glAttachShader(pCVar1,program,shader);
  glu::CallLogWrapper::glLinkProgram(pCVar1,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     pCVar1,program,0x8b89,2);
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  buffer._0_8_ = buffer + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)buffer,"longInputAttributeName","");
  local_9d0 = program;
  verifyProgramParam(pTVar2,pCVar1,program,0x8b8a,buffer._8_4_ + 1);
  local_9c0 = pCVar1;
  if ((char *)buffer._0_8_ != buffer + 0x10) {
    operator_delete((void *)buffer._0_8_,buffer._16_8_ + 1);
  }
  GVar5 = 0;
  bVar7 = true;
  do {
    memset((string *)buffer,0,0x800);
    buffer[0] = 'x';
    written = 0;
    size = 0;
    type = 0;
    glu::CallLogWrapper::glGetActiveAttrib
              (local_9c0,local_9d0,GVar5,0x800,&written,&size,&type,(GLchar *)buffer);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar6 = deStringBeginsWith(buffer,"longInputAttributeName");
    GVar4 = written;
    if (dVar6 == 0) {
      dVar6 = deStringBeginsWith(buffer,"shortName");
      GVar4 = written;
      if (dVar6 != 0) {
        pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
        _written_1 = local_9a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&written_1,"shortName","");
        checkIntEquals(pTVar2,GVar4,local_9b0[0]);
        goto LAB_006294b0;
      }
      _written_1 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                   m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_9b0,"// ERROR: Got unexpected attribute name.",0x28);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&written_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9b0);
      std::ios_base::~ios_base(local_940);
      pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got unexpected name");
      }
    }
    else {
      pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      _written_1 = local_9a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&written_1,"longInputAttributeName","");
      checkIntEquals(pTVar2,GVar4,local_9b0[0]);
LAB_006294b0:
      if (_written_1 != local_9a8) {
        operator_delete(_written_1,(ulong)((long)&(local_9a8[0].m_log)->flags + 1));
      }
    }
    GVar5 = 1;
    bVar3 = !bVar7;
    bVar7 = false;
    if (bVar3) {
      memset((string *)buffer,0,0x800);
      pCVar1 = local_9c0;
      GVar5 = local_9d0;
      buffer[0] = 'x';
      _written_1 = (TestLog *)((ulong)_written_1 & 0xffffffff00000000);
      written = 0;
      size = 0;
      glu::CallLogWrapper::glGetActiveAttrib
                (local_9c0,local_9d0,0,1,&written_1,&written,(GLenum *)&size,(GLchar *)buffer);
      ApiCase::expectError(&this->super_ApiCase,0);
      checkIntEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     written_1,0);
      glu::CallLogWrapper::glDeleteShader(pCVar1,local_9c8);
      glu::CallLogWrapper::glDeleteShader(pCVar1,local_9cc);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar5);
      ApiCase::expectError(&this->super_ApiCase,0);
      return;
    }
  } while( true );
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		static const char* testVertSource =
			"#version 300 es\n"
			"in highp vec2 longInputAttributeName;\n"
			"in highp vec2 shortName;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = longInputAttributeName.yxxy + shortName.xyxy;\n"
			"}\n\0";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_ATTRIBUTES, 2);
		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_ATTRIBUTE_MAX_LENGTH, (GLint)std::string("longInputAttributeName").length() + 1); // does include null-terminator

		// check names
		for (int attributeNdx = 0; attributeNdx < 2; ++attributeNdx)
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			GLint size = 0;
			GLenum type = 0;
			glGetActiveAttrib(program, attributeNdx, DE_LENGTH_OF_ARRAY(buffer), &written, &size, &type, buffer);
			expectError(GL_NO_ERROR);

			if (deStringBeginsWith(buffer, "longInputAttributeName"))
			{
				checkIntEquals(m_testCtx, written, (GLint)std::string("longInputAttributeName").length()); // does NOT include null-terminator
			}
			else if (deStringBeginsWith(buffer, "shortName"))
			{
				checkIntEquals(m_testCtx, written, (GLint)std::string("shortName").length()); // does NOT include null-terminator
			}
			else
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Got unexpected attribute name." << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected name");
			}
		}

		// and with too short buffer
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			GLint size = 0;
			GLenum type = 0;

			glGetActiveAttrib(program, 0, 1, &written, &size, &type, buffer);
			expectError(GL_NO_ERROR);
			checkIntEquals(m_testCtx, written, 0);
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}